

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::Append(SnappyIOVecWriter *this,char *ip,size_t len,char **param_3)

{
  bool bVar1;
  
  if (this->output_limit_ < this->total_written_ + len) {
    return false;
  }
  bVar1 = AppendNoCheck(this,ip,len);
  return bVar1;
}

Assistant:

inline bool Append(const char* ip, size_t len, char**) {
    if (total_written_ + len > output_limit_) {
      return false;
    }

    return AppendNoCheck(ip, len);
  }